

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

string * __thiscall
cmGlobalNinjaMultiGenerator::ExpandCFGIntDir
          (string *__return_storage_ptr__,cmGlobalNinjaMultiGenerator *this,string *str,
          string *config)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  allocator<char> local_41;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  iVar2 = (*(this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.
            super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x15])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,(char *)CONCAT44(extraout_var,iVar2),&local_41);
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,&local_40,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaMultiGenerator::ExpandCFGIntDir(
  const std::string& str, const std::string& config) const
{
  std::string result = str;
  cmSystemTools::ReplaceString(result, this->GetCMakeCFGIntDir(), config);
  return result;
}